

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O3

StatusOr<unsigned_int> * __thiscall
google::protobuf::util::converter::DataPiece::GenericConvert<unsigned_int>
          (StatusOr<unsigned_int> *__return_storage_ptr__,DataPiece *this)

{
  StringPiece error_message;
  StringPiece error_message_00;
  StringPiece error_message_01;
  StringPiece error_message_02;
  uint uVar1;
  uint in_EDX;
  uint value;
  ulong value_00;
  StringPiece default_string;
  StringPiece error_message_03;
  StringPiece error_message_04;
  StringPiece error_message_05;
  StringPiece error_message_06;
  string local_90;
  Status local_70;
  Status local_48;
  
  switch(this->type_) {
  case TYPE_INT32:
    value = (this->field_2).i32_;
    uVar1 = ((0 < (int)value) - 1) + (uint)(0 < (int)value);
    if (value == 0) {
      uVar1 = 0;
    }
    if (uVar1 == (value != 0)) {
      Status::Status(&__return_storage_ptr__->status_);
      Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
      goto LAB_003048a6;
    }
    ValueAsString<int>(&local_90,value);
    error_message_02.length_ = local_90._M_string_length;
    error_message_02.ptr_ = local_90._M_dataplus._M_p;
    if ((long)local_90._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_90._M_string_length,"size_t to int conversion");
    }
    Status::Status(&local_48,INVALID_ARGUMENT,error_message_02);
    Status::Status(&__return_storage_ptr__->status_);
    if (local_48.error_code_ != OK) {
      Status::operator=(&__return_storage_ptr__->status_,&local_48);
      goto LAB_00304b92;
    }
    error_message_06.length_ = 0x23;
    error_message_06.ptr_ = "Status::OK is not a valid argument.";
    Status::Status(&local_70,INTERNAL,error_message_06);
    Status::operator=(&__return_storage_ptr__->status_,&local_70);
    break;
  case TYPE_INT64:
    value_00 = (this->field_2).i64_;
    if ((value_00 >> 0x20 == 0) && ((value_00 != 0) != ((int)value_00 == 0))) {
      Status::Status(&__return_storage_ptr__->status_);
      Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
LAB_00304929:
      __return_storage_ptr__->value_ = (uint)value_00;
      return __return_storage_ptr__;
    }
    ValueAsString<long>(&local_90,value_00);
    error_message_01.length_ = local_90._M_string_length;
    error_message_01.ptr_ = local_90._M_dataplus._M_p;
    if ((long)local_90._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_90._M_string_length,"size_t to int conversion");
    }
    Status::Status(&local_48,INVALID_ARGUMENT,error_message_01);
    Status::Status(&__return_storage_ptr__->status_);
    if (local_48.error_code_ != OK) {
      Status::operator=(&__return_storage_ptr__->status_,&local_48);
      goto LAB_00304b92;
    }
    error_message_05.length_ = 0x23;
    error_message_05.ptr_ = "Status::OK is not a valid argument.";
    Status::Status(&local_70,INTERNAL,error_message_05);
    Status::operator=(&__return_storage_ptr__->status_,&local_70);
    break;
  case TYPE_UINT32:
    value = (this->field_2).i32_;
    Status::Status(&__return_storage_ptr__->status_);
    Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
LAB_003048a6:
    __return_storage_ptr__->value_ = value;
    return __return_storage_ptr__;
  case TYPE_UINT64:
    value_00 = (this->field_2).u64_;
    if ((value_00 >> 0x20 == 0) && ((value_00 != 0) != ((int)value_00 == 0))) {
      Status::Status(&__return_storage_ptr__->status_);
      Status::operator=(&__return_storage_ptr__->status_,(Status *)Status::OK);
      goto LAB_00304929;
    }
    ValueAsString<unsigned_long>(&local_90,value_00);
    error_message_00.length_ = local_90._M_string_length;
    error_message_00.ptr_ = local_90._M_dataplus._M_p;
    if ((long)local_90._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_90._M_string_length,"size_t to int conversion");
    }
    Status::Status(&local_48,INVALID_ARGUMENT,error_message_00);
    Status::Status(&__return_storage_ptr__->status_);
    if (local_48.error_code_ != OK) {
      Status::operator=(&__return_storage_ptr__->status_,&local_48);
      goto LAB_00304b92;
    }
    error_message_04.length_ = 0x23;
    error_message_04.ptr_ = "Status::OK is not a valid argument.";
    Status::Status(&local_70,INTERNAL,error_message_04);
    Status::operator=(&__return_storage_ptr__->status_,&local_70);
    break;
  case TYPE_DOUBLE:
    (anonymous_namespace)::ValidateNumberConversion<unsigned_int,double>
              (__return_storage_ptr__,(_anonymous_namespace_ *)(long)(this->field_2).double_,in_EDX,
               (this->field_2).double_);
    return __return_storage_ptr__;
  case TYPE_FLOAT:
    (anonymous_namespace)::ValidateNumberConversion<unsigned_int,float>
              (__return_storage_ptr__,(_anonymous_namespace_ *)(long)(this->field_2).float_,in_EDX,
               (this->field_2).float_);
    return __return_storage_ptr__;
  default:
    default_string.length_ = 0x48;
    default_string.ptr_ = "Wrong type. Bool, Enum, String and Cord not supported in GenericConvert."
    ;
    ValueAsStringOrDefault_abi_cxx11_(&local_90,this,default_string);
    error_message.length_ = local_90._M_string_length;
    error_message.ptr_ = local_90._M_dataplus._M_p;
    if ((long)local_90._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_90._M_string_length,"size_t to int conversion");
    }
    Status::Status(&local_48,INVALID_ARGUMENT,error_message);
    Status::Status(&__return_storage_ptr__->status_);
    if (local_48.error_code_ != OK) {
      Status::operator=(&__return_storage_ptr__->status_,&local_48);
      goto LAB_00304b92;
    }
    error_message_03.length_ = 0x23;
    error_message_03.ptr_ = "Status::OK is not a valid argument.";
    Status::Status(&local_70,INTERNAL,error_message_03);
    Status::operator=(&__return_storage_ptr__->status_,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.error_message_._M_dataplus._M_p != &local_70.error_message_.field_2) {
    operator_delete(local_70.error_message_._M_dataplus._M_p);
  }
LAB_00304b92:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.error_message_._M_dataplus._M_p != &local_48.error_message_.field_2) {
    operator_delete(local_48.error_message_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> DataPiece::GenericConvert() const {
  switch (type_) {
    case TYPE_INT32:
      return NumberConvertAndCheck<To, int32>(i32_);
    case TYPE_INT64:
      return NumberConvertAndCheck<To, int64>(i64_);
    case TYPE_UINT32:
      return NumberConvertAndCheck<To, uint32>(u32_);
    case TYPE_UINT64:
      return NumberConvertAndCheck<To, uint64>(u64_);
    case TYPE_DOUBLE:
      return NumberConvertAndCheck<To, double>(double_);
    case TYPE_FLOAT:
      return NumberConvertAndCheck<To, float>(float_);
    default:  // TYPE_ENUM, TYPE_STRING, TYPE_CORD, TYPE_BOOL
      return InvalidArgument(ValueAsStringOrDefault(
          "Wrong type. Bool, Enum, String and Cord not supported in "
          "GenericConvert."));
  }
}